

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

void drmp3_L3_dct3_9(float *y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar1 = y[2];
  fVar5 = y[4];
  fVar4 = y[8];
  fVar11 = y[1];
  fVar6 = y[6] * 0.5 + *y;
  fVar3 = *y - y[6];
  fVar2 = (fVar1 + fVar5) * 0.9396926;
  fVar7 = (fVar1 + fVar4) * 0.76604444;
  fVar8 = (fVar5 - fVar4) * 0.17364818;
  fVar5 = (fVar4 - fVar1) + fVar5;
  fVar4 = fVar3 - fVar5 * 0.5;
  y[4] = fVar5 + fVar3;
  fVar3 = (fVar6 - fVar7) + fVar8;
  fVar7 = (fVar6 - fVar2) + fVar7;
  fVar8 = (fVar2 + fVar6) - fVar8;
  fVar1 = y[5];
  fVar5 = y[7];
  fVar10 = (fVar11 + fVar1) * 0.9848077;
  fVar9 = y[3] * 0.8660254;
  fVar2 = (fVar1 - fVar5) * 0.34202015;
  fVar6 = (fVar11 + fVar5) * 0.64278764;
  fVar1 = ((fVar11 - fVar1) - fVar5) * 0.8660254;
  fVar5 = (fVar2 - fVar9) - fVar10;
  fVar11 = (fVar10 - fVar9) - fVar6;
  fVar6 = (fVar2 + fVar9) - fVar6;
  *y = fVar8 - fVar5;
  y[1] = fVar4 + fVar1;
  y[2] = fVar7 - fVar6;
  y[3] = fVar3 + fVar11;
  y[5] = fVar3 - fVar11;
  y[6] = fVar6 + fVar7;
  y[7] = fVar4 - fVar1;
  y[8] = fVar5 + fVar8;
  return;
}

Assistant:

static void drmp3_L3_dct3_9(float *y)
{
    float s0, s1, s2, s3, s4, s5, s6, s7, s8, t0, t2, t4;

    s0 = y[0]; s2 = y[2]; s4 = y[4]; s6 = y[6]; s8 = y[8];
    t0 = s0 + s6*0.5f;
    s0 -= s6;
    t4 = (s4 + s2)*0.93969262f;
    t2 = (s8 + s2)*0.76604444f;
    s6 = (s4 - s8)*0.17364818f;
    s4 += s8 - s2;

    s2 = s0 - s4*0.5f;
    y[4] = s4 + s0;
    s8 = t0 - t2 + s6;
    s0 = t0 - t4 + t2;
    s4 = t0 + t4 - s6;

    s1 = y[1]; s3 = y[3]; s5 = y[5]; s7 = y[7];

    s3 *= 0.86602540f;
    t0 = (s5 + s1)*0.98480775f;
    t4 = (s5 - s7)*0.34202014f;
    t2 = (s1 + s7)*0.64278761f;
    s1 = (s1 - s5 - s7)*0.86602540f;

    s5 = t0 - s3 - t2;
    s7 = t4 - s3 - t0;
    s3 = t4 + s3 - t2;

    y[0] = s4 - s7;
    y[1] = s2 + s1;
    y[2] = s0 - s3;
    y[3] = s8 + s5;
    y[5] = s8 - s5;
    y[6] = s0 + s3;
    y[7] = s2 - s1;
    y[8] = s4 + s7;
}